

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O1

void __thiscall
gmath::SturmChain<double>::SturmChain(SturmChain<double> *this,Polynomial<double> *p)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  Polynomial<double> *pPVar5;
  long lVar6;
  long lVar7;
  Polynomial<double> ret;
  Polynomial<double> r;
  Polynomial<double> q;
  Polynomial<double> local_60;
  Polynomial<double> local_50;
  Polynomial<double> local_40;
  
  local_40.len = 0xc;
  local_40.used = 0;
  local_40.c = (double *)operator_new__(0x60);
  local_40.used = 1;
  *local_40.c = 0.0;
  local_50.len = 0xc;
  local_50.used = 0;
  local_50.c = (double *)operator_new__(0x60);
  local_50.used = 1;
  *local_50.c = 0.0;
  this->n = 0;
  iVar1 = p->used;
  lVar6 = (long)iVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar4 = lVar6 * 0x10 + 8;
  }
  plVar2 = (long *)operator_new__(uVar4);
  *plVar2 = lVar6;
  if (iVar1 != 0) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar7 + 8) = 0xc;
      puVar3 = (undefined8 *)operator_new__(0x60);
      *(undefined8 **)((long)plVar2 + lVar7 + 0x10) = puVar3;
      *(undefined4 *)((long)plVar2 + lVar7 + 0xc) = 1;
      *puVar3 = 0;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 * 0x10 != lVar7);
  }
  this->f = (Polynomial<double> *)(plVar2 + 1);
  Polynomial<double>::operator=((Polynomial<double> *)(plVar2 + 1),p);
  while (pPVar5 = this->f, 1 < pPVar5->used) {
    local_60.len = 0xc;
    local_60.used = 0;
    local_60.c = (double *)operator_new__(0x60);
    local_60.used = 1;
    *local_60.c = 0.0;
    if (1 < pPVar5->used) {
      lVar6 = 1;
      do {
        Polynomial<double>::set(&local_60,(int)lVar6 + -1,(double)(int)lVar6 * pPVar5->c[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < pPVar5->used);
    }
    Polynomial<double>::operator=(this->f + 1,&local_60);
    if (local_60.c != (double *)0x0) {
      operator_delete__(local_60.c);
    }
    this->n = 2;
    pPVar5 = this->f;
    if (pPVar5->used < 3) break;
    iVar1 = 2;
    while( true ) {
      lVar6 = (long)iVar1;
      if (pPVar5[lVar6 + -1].used < 2) goto LAB_0010fa78;
      div<double>(pPVar5 + lVar6 + -2,pPVar5 + lVar6 + -1,&local_40,&local_50);
      if (((local_50.used == 1) && (*local_50.c == 0.0)) && (!NAN(*local_50.c))) break;
      Polynomial<double>::operator-(&local_60);
      Polynomial<double>::operator=(this->f + this->n,&local_60);
      if (local_60.c != (double *)0x0) {
        operator_delete__(local_60.c);
      }
      iVar1 = this->n + 1;
      this->n = iVar1;
      pPVar5 = this->f;
      if (pPVar5->used <= iVar1) goto LAB_0010fa78;
    }
    div<double>(this->f,this->f + (long)this->n + -1,&local_40,&local_50);
    Polynomial<double>::operator=(this->f,&local_40);
  }
LAB_0010fa78:
  if (local_50.c != (double *)0x0) {
    operator_delete__(local_50.c);
  }
  if (local_40.c != (double *)0x0) {
    operator_delete__(local_40.c);
  }
  return;
}

Assistant:

SturmChain(const Polynomial<T> &p)
    {
      Polynomial<T> q, r;

      assert(p.getDegree() > 0);

      n=0;
      f=new Polynomial<T> [p.getDegree()+1];

      f[0]=p;

      bool compute=true;

      while (compute && f[0].getDegree() > 0)
      {
        compute=false;

        f[1]=d(f[0]);

        n=2;

        while (n < f[0].getDegree()+1 && f[n-1].getDegree() > 0)
        {
          div(f[n-2], f[n-1], q, r);

          // check for multiple roots

          if (r.getDegree() == 0 && r[0] == 0)
          {
            // f[n-1] is the common divisor of f[0], divide it out to get
            // rid of multiple roots and restart computation of Sturm chain

            div(f[0], f[n-1], q, r);
            f[0]=q;
            compute=true;
            break;
          }

          f[n]=-r;
          n++;
        }
      }
    }